

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeMergeEngineLevel0(SortSubtask *pTask,int nPMA,i64 *piOffset,MergeEngine **ppOut)

{
  PmaReader *pReadr;
  PmaReader *pPVar1;
  uint uVar2;
  MergeEngine *pMerger;
  i64 iOff;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  u64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iOff = *piOffset;
  pMerger = vdbeMergeEngineNew(nPMA);
  *ppOut = pMerger;
  uVar6 = 0;
  uVar4 = 7;
  if (pMerger != (MergeEngine *)0x0) {
    uVar4 = uVar6;
  }
  lVar5 = 0;
  while ((iVar3 = (int)uVar4, lVar5 < nPMA && (iVar3 == 0))) {
    pPVar1 = pMerger->aReadr;
    pReadr = (PmaReader *)((long)&pPVar1->iReadOff + uVar6);
    uVar2 = vdbePmaReaderSeek(pTask,pReadr,&pTask->file,iOff);
    if (uVar2 == 0) {
      local_40 = 0;
      uVar2 = vdbePmaReadVarint(pReadr,&local_40);
      *(u64 *)((long)&pPVar1->iEof + uVar6) = local_40 + *(long *)((long)&pPVar1->iReadOff + uVar6);
      if (uVar2 == 0) {
        uVar2 = vdbePmaReaderNext(pReadr);
      }
    }
    iOff = *(i64 *)((long)&pPVar1->iEof + uVar6);
    lVar5 = lVar5 + 1;
    uVar6 = uVar6 + 0x50;
    uVar4 = (ulong)uVar2;
  }
  if (iVar3 != 0) {
    vdbeMergeEngineFree(pMerger);
    *ppOut = (MergeEngine *)0x0;
  }
  *piOffset = iOff;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int vdbeMergeEngineLevel0(
  SortSubtask *pTask,             /* Sorter task to read from */
  int nPMA,                       /* Number of PMAs to read */
  i64 *piOffset,                  /* IN/OUT: Readr offset in pTask->file */
  MergeEngine **ppOut             /* OUT: New merge-engine */
){
  MergeEngine *pNew;              /* Merge engine to return */
  i64 iOff = *piOffset;
  int i;
  int rc = SQLITE_OK;

  *ppOut = pNew = vdbeMergeEngineNew(nPMA);
  if( pNew==0 ) rc = SQLITE_NOMEM_BKPT;

  for(i=0; i<nPMA && rc==SQLITE_OK; i++){
    i64 nDummy = 0;
    PmaReader *pReadr = &pNew->aReadr[i];
    rc = vdbePmaReaderInit(pTask, &pTask->file, iOff, pReadr, &nDummy);
    iOff = pReadr->iEof;
  }

  if( rc!=SQLITE_OK ){
    vdbeMergeEngineFree(pNew);
    *ppOut = 0;
  }
  *piOffset = iOff;
  return rc;
}